

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDaysOperator>
               (long *ldata,interval_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  duckdb *pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  ValidityMask *pVVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  idx_t idx_in_entry;
  ulong uVar11;
  int64_t *piVar12;
  undefined1 auVar13 [16];
  _Head_base<0UL,_unsigned_long_*,_false> local_70;
  ValidityMask *local_68;
  long *local_60;
  string local_58;
  buffer_ptr<ValidityBuffer> *local_38;
  
  local_68 = result_mask;
  local_60 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      piVar12 = &result_data->micros;
      uVar11 = 0;
      do {
        uVar8 = uVar11;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar11];
        }
        pdVar2 = (duckdb *)local_60[uVar8];
        bVar7 = duckdb::TryCast::Operation<long,int>((long)pdVar2,(int *)&local_70,false);
        if (!bVar7) {
          auVar13 = __cxa_allocate_exception(0x10);
          CastExceptionText<long,int>(&local_58,pdVar2,auVar13._8_8_);
          duckdb::InvalidInputException::InvalidInputException(auVar13._0_8_,(string *)&local_58);
          __cxa_throw(auVar13._0_8_,&InvalidInputException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        ((interval_t *)(piVar12 + -1))->months = (int)((long)local_70._M_head_impl << 0x20);
        ((interval_t *)(piVar12 + -1))->days =
             (int)((ulong)((long)local_70._M_head_impl << 0x20) >> 0x20);
        *piVar12 = 0;
        uVar11 = uVar11 + 1;
        piVar12 = piVar12 + 2;
      } while (count != uVar11);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_38 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar12 = &result_data->micros;
    uVar11 = 0;
    do {
      pVVar4 = local_68;
      uVar8 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar11];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) == 0) {
        _Var10._M_head_impl = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_70._M_head_impl =
               (unsigned_long *)(local_68->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)&local_70);
          sVar6 = local_58._M_string_length;
          _Var5._M_p = local_58._M_dataplus._M_p;
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          this = (pVVar4->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (pVVar4->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var5._M_p;
          (pVVar4->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_38);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var10._M_head_impl
          ;
        }
        bVar3 = (byte)uVar11 & 0x3f;
        _Var10._M_head_impl[uVar11 >> 6] =
             _Var10._M_head_impl[uVar11 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3)
        ;
      }
      else {
        pdVar2 = (duckdb *)local_60[uVar8];
        bVar7 = duckdb::TryCast::Operation<long,int>((long)pdVar2,(int *)&local_70,false);
        if (!bVar7) {
          auVar13 = __cxa_allocate_exception(0x10);
          CastExceptionText<long,int>(&local_58,pdVar2,auVar13._8_8_);
          duckdb::InvalidInputException::InvalidInputException(auVar13._0_8_,(string *)&local_58);
          __cxa_throw(auVar13._0_8_,&InvalidInputException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        ((interval_t *)(piVar12 + -1))->months = (int)((long)local_70._M_head_impl << 0x20);
        ((interval_t *)(piVar12 + -1))->days =
             (int)((ulong)((long)local_70._M_head_impl << 0x20) >> 0x20);
        *piVar12 = 0;
      }
      uVar11 = uVar11 + 1;
      piVar12 = piVar12 + 2;
    } while (count != uVar11);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}